

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::EnumValueDescriptor::CopyTo
          (EnumValueDescriptor *this,EnumValueDescriptorProto *proto)

{
  int32 iVar1;
  string *initial_value;
  string *psVar2;
  EnumValueOptions *pEVar3;
  EnumValueOptions *pEVar4;
  
  initial_value = *(string **)this;
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
  psVar2 = (proto->name_).ptr_;
  if (psVar2 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstanceNoArena(&proto->name_,initial_value);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  iVar1 = *(int32 *)(this + 0x10);
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 4;
  proto->number_ = iVar1;
  pEVar4 = *(EnumValueOptions **)(this + 0x20);
  pEVar3 = EnumValueOptions::default_instance();
  if (pEVar4 != pEVar3) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 2;
    pEVar4 = proto->options_;
    if (pEVar4 == (EnumValueOptions *)0x0) {
      pEVar4 = (EnumValueOptions *)operator_new(0x70);
      EnumValueOptions::EnumValueOptions(pEVar4);
      proto->options_ = pEVar4;
    }
    EnumValueOptions::CopyFrom(pEVar4,*(EnumValueOptions **)(this + 0x20));
    return;
  }
  return;
}

Assistant:

void EnumValueDescriptor::CopyTo(EnumValueDescriptorProto* proto) const {
  proto->set_name(name());
  proto->set_number(number());

  if (&options() != &EnumValueOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}